

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

char * get_include_fname(c2m_ctx_t c2m_ctx,token_t t,char **content)

{
  char *name;
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  char *unaff_R12;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  str_t sVar7;
  
  *content = (char *)0x0;
  if ((*(short *)t != 0x102) && (*(short *)t != 0x13e)) {
    __assert_fail("t->code == T_STR || t->code == T_HEADER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x99b,"const char *get_include_fname(c2m_ctx_t, token_t, const char **)");
  }
  name = (t->node->u).s.s;
  if (*name != '/') {
    if (*t->repr == '\"') {
      pcVar2 = c2m_ctx->cs->fname;
      if (pcVar2 != (char *)0x0) {
        unaff_R12 = get_full_name(c2m_ctx,pcVar2,name,0);
        iVar1 = file_found_p(unaff_R12);
        if (iVar1 != 0) {
          sVar7 = uniq_cstr(c2m_ctx,unaff_R12);
          return sVar7.s;
        }
      }
      bVar6 = *c2m_ctx->header_dirs == (char *)0x0;
      if (!bVar6) {
        unaff_R12 = get_full_name(c2m_ctx,*c2m_ctx->header_dirs,name,1);
        iVar1 = file_found_p(unaff_R12);
        if (iVar1 == 0) {
          lVar4 = 8;
          do {
            pcVar2 = *(char **)((long)c2m_ctx->header_dirs + lVar4);
            bVar6 = pcVar2 == (char *)0x0;
            if (bVar6) goto LAB_0019492f;
            unaff_R12 = get_full_name(c2m_ctx,pcVar2,name,1);
            iVar1 = file_found_p(unaff_R12);
            lVar4 = lVar4 + 8;
          } while (iVar1 == 0);
        }
        sVar7 = uniq_cstr(c2m_ctx,unaff_R12);
        unaff_R12 = sVar7.s;
      }
LAB_0019492f:
      if (!bVar6) {
        return unaff_R12;
      }
    }
    ppcVar3 = &standard_includes[0].content;
    bVar6 = false;
    uVar5 = 0;
    do {
      if ((((string_include_t *)(ppcVar3 + -1))->name != (char *)0x0) &&
         (iVar1 = strcmp(name,((string_include_t *)(ppcVar3 + -1))->name), iVar1 == 0)) {
        *content = *ppcVar3;
        unaff_R12 = name;
        break;
      }
      bVar6 = 9 < uVar5;
      uVar5 = uVar5 + 1;
      ppcVar3 = ppcVar3 + 2;
    } while (uVar5 != 0xb);
    if (!bVar6) {
      return unaff_R12;
    }
    bVar6 = *c2m_ctx->system_header_dirs == (char *)0x0;
    if (!bVar6) {
      pcVar2 = get_full_name(c2m_ctx,*c2m_ctx->system_header_dirs,name,1);
      iVar1 = file_found_p(pcVar2);
      if (iVar1 == 0) {
        lVar4 = 8;
        do {
          pcVar2 = *(char **)((long)c2m_ctx->system_header_dirs + lVar4);
          bVar6 = pcVar2 == (char *)0x0;
          if (bVar6) goto LAB_00194a0e;
          pcVar2 = get_full_name(c2m_ctx,pcVar2,name,1);
          iVar1 = file_found_p(pcVar2);
          lVar4 = lVar4 + 8;
        } while (iVar1 == 0);
      }
      sVar7 = uniq_cstr(c2m_ctx,pcVar2);
      unaff_R12 = sVar7.s;
    }
LAB_00194a0e:
    if (!bVar6) {
      return unaff_R12;
    }
  }
  return name;
}

Assistant:

static const char *get_include_fname (c2m_ctx_t c2m_ctx, token_t t, const char **content) {
  const char *fullname, *name;

  *content = NULL;
  assert (t->code == T_STR || t->code == T_HEADER);
  if ((name = t->node->u.s.s)[0] != '/') {
    if (t->repr[0] == '"') {
      /* Search relative to the current source dir */
      if (cs->fname != NULL) {
        fullname = get_full_name (c2m_ctx, cs->fname, name, FALSE);
        if (file_found_p (fullname)) return uniq_cstr (c2m_ctx, fullname).s;
      }
      for (size_t i = 0; header_dirs[i] != NULL; i++) {
        fullname = get_full_name (c2m_ctx, header_dirs[i], name, TRUE);
        if (file_found_p (fullname)) return uniq_cstr (c2m_ctx, fullname).s;
      }
    }
    for (size_t i = 0; i < sizeof (standard_includes) / sizeof (string_include_t); i++)
      if (standard_includes[i].name != NULL && strcmp (name, standard_includes[i].name) == 0) {
        *content = standard_includes[i].content;
        return name;
      }
    for (size_t i = 0; system_header_dirs[i] != NULL; i++) {
      fullname = get_full_name (c2m_ctx, system_header_dirs[i], name, TRUE);
      if (file_found_p (fullname)) return uniq_cstr (c2m_ctx, fullname).s;
    }
  }
  return name;
}